

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O2

void rffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [32];
  long lVar10;
  long lVar11;
  long NDiffU;
  float *pfVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  long lStack_50;
  
  switch(M) {
  case 0:
    break;
  case 1:
    lVar10 = 1L << (M & 0x3fU);
    for (lVar11 = Rows; 0 < lVar11; lVar11 = lVar11 + -1) {
      fVar4 = *ioptr;
      *ioptr = ioptr[1] + fVar4;
      ioptr[1] = fVar4 - ioptr[1];
      ioptr = ioptr + lVar10;
    }
    Rows = Rows & Rows >> 0x3f;
    goto LAB_00103e96;
  case 2:
    lVar10 = 4;
LAB_00103e96:
    pfVar12 = ioptr + 3;
    for (; 0 < Rows; Rows = Rows - 1) {
      fVar4 = pfVar12[-3];
      fVar5 = pfVar12[-2];
      fVar6 = pfVar12[-1] + fVar4;
      fVar7 = *pfVar12 + fVar5;
      pfVar12[-3] = fVar7 + fVar6;
      pfVar12[-2] = fVar6 - fVar7;
      pfVar12[-1] = fVar4 - pfVar12[-1];
      *pfVar12 = *pfVar12 - fVar5;
      pfVar12 = pfVar12 + lVar10;
    }
    break;
  case 3:
    pfVar12 = ioptr + 7;
    while (0 < Rows) {
      Rows = Rows + -1;
      fVar4 = pfVar12[-1] + pfVar12[-5];
      fVar5 = *pfVar12 + pfVar12[-4];
      uVar1 = *(ulong *)(pfVar12 + -7);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar1;
      uVar3 = *(ulong *)(pfVar12 + -3);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar3;
      fVar8 = (pfVar12[-4] - *pfVar12) * -1.4142135;
      auVar19._0_4_ = (float)uVar3 + (float)uVar1;
      auVar19._4_4_ = (float)(uVar3 >> 0x20) + (float)(uVar1 >> 0x20);
      auVar19._8_8_ = 0;
      auVar16 = vsubps_avx(auVar17,auVar18);
      auVar14 = vmovshdup_avx(auVar19);
      fVar6 = auVar19._0_4_ + fVar4;
      fVar7 = auVar14._0_4_ + fVar5;
      auVar20._0_4_ = auVar16._0_4_ * 2.0;
      auVar20._4_4_ = auVar16._4_4_ * 1.4142135;
      auVar20._8_4_ = auVar16._8_4_ * 0.0;
      auVar20._12_4_ = auVar16._12_4_ * 0.0;
      pfVar12[-3] = auVar19._0_4_ - fVar4;
      auVar15 = vmovshdup_avx(auVar20);
      auVar13 = vhaddps_avx(auVar20,auVar20);
      pfVar12[-2] = fVar5 - auVar14._0_4_;
      auVar17 = ZEXT416((uint)(pfVar12[-5] - pfVar12[-1]));
      auVar14 = vfnmsub231ss_fma(auVar15,auVar17,SUB6416(ZEXT464(0x40000000),0));
      pfVar12[-7] = fVar7 + fVar6;
      pfVar12[-6] = fVar6 - fVar7;
      auVar18 = ZEXT416((uint)(auVar13._0_4_ + fVar8));
      auVar15 = vfmsub213ss_fma(auVar16,SUB6416(ZEXT464(0x40800000),0),auVar18);
      auVar13 = ZEXT416((uint)(fVar8 + auVar14._0_4_));
      auVar14 = vfmadd213ss_fma(auVar17,SUB6416(ZEXT464(0x40800000),0),auVar13);
      auVar13 = vinsertps_avx(auVar18,auVar13,0x10);
      auVar16._0_4_ = auVar13._0_4_ * 0.5;
      auVar16._4_4_ = auVar13._4_4_ * 0.5;
      auVar16._8_4_ = auVar13._8_4_ * 0.5;
      auVar16._12_4_ = auVar13._12_4_ * 0.5;
      uVar2 = vmovlps_avx(auVar16);
      *(undefined8 *)(pfVar12 + -5) = uVar2;
      pfVar12[-1] = auVar15._0_4_ * 0.5;
      *pfVar12 = auVar14._0_4_ * 0.5;
      pfVar12 = pfVar12 + (1L << (M & 0x3fU));
    }
    break;
  case 4:
    pfVar12 = ioptr + 0xf;
    while (0 < Rows) {
      Rows = Rows + -1;
      auVar13 = vaddss_avx512f(ZEXT416((uint)pfVar12[-5]),ZEXT416((uint)pfVar12[-0xd]));
      auVar14 = vaddss_avx512f(ZEXT416((uint)pfVar12[-4]),ZEXT416((uint)pfVar12[-0xc]));
      auVar15 = vaddss_avx512f(ZEXT416((uint)pfVar12[-1]),ZEXT416((uint)pfVar12[-9]));
      auVar16 = vsubss_avx512f(ZEXT416((uint)pfVar12[-9]),ZEXT416((uint)pfVar12[-1]));
      auVar17 = vaddss_avx512f(ZEXT416((uint)*pfVar12),ZEXT416((uint)pfVar12[-8]));
      auVar18 = vsubss_avx512f(ZEXT416((uint)pfVar12[-8]),ZEXT416((uint)*pfVar12));
      auVar22 = ZEXT416((uint)(pfVar12[-0xc] - pfVar12[-4]));
      auVar19 = vaddss_avx512f(auVar16,auVar22);
      auVar20 = vsubss_avx512f(auVar14,auVar17);
      auVar14 = vaddss_avx512f(auVar17,auVar14);
      auVar21 = ZEXT416((uint)(pfVar12[-0xd] - pfVar12[-5]));
      auVar17 = vsubss_avx512f(auVar21,auVar18);
      auVar16 = vsubss_avx512f(auVar22,auVar16);
      auVar18 = vaddss_avx512f(auVar18,auVar21);
      auVar21 = vaddss_avx512f(auVar15,auVar13);
      auVar15 = vsubss_avx512f(auVar13,auVar15);
      auVar13 = SUB6416(ZEXT464(0x3f3504f3),0);
      auVar18 = vmulss_avx512f(auVar18,auVar13);
      auVar16 = vmulss_avx512f(auVar16,ZEXT416(0xbf3504f3));
      auVar17 = vmulss_avx512f(auVar17,auVar13);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(pfVar12 + -0xb);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)(pfVar12 + -0xf);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)(pfVar12 + -7);
      auVar19 = vmulss_avx512f(auVar19,auVar13);
      auVar20 = vmulss_avx512f(auVar20,SUB6416(ZEXT464(0xbfb504f3),0));
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *(ulong *)(pfVar12 + -3);
      auVar22 = vsubps_avx512vl(auVar24,auVar13);
      auVar23 = vaddps_avx512vl(auVar26,auVar25);
      auVar24 = vaddps_avx512vl(auVar13,auVar24);
      auVar13 = vsubps_avx(auVar25,auVar26);
      auVar25 = vaddps_avx512vl(auVar24,auVar23);
      auVar26 = vmovshdup_avx512vl(auVar22);
      auVar23 = vsubps_avx512vl(auVar23,auVar24);
      auVar24 = vmovshdup_avx512vl(auVar13);
      auVar27 = vsubss_avx512f(auVar13,auVar26);
      auVar13 = vaddss_avx512f(auVar26,auVar13);
      auVar26 = vaddss_avx512f(auVar22,auVar24);
      auVar22 = vsubss_avx512f(auVar24,auVar22);
      auVar24 = vmovshdup_avx512vl(auVar25);
      auVar29._0_4_ = auVar23._0_4_ * 2.0;
      auVar29._4_4_ = auVar23._4_4_ * 1.4142135;
      auVar29._8_4_ = auVar23._8_4_ * 0.0;
      auVar29._12_4_ = auVar23._12_4_ * 0.0;
      auVar28 = vsubss_avx512f(auVar14,auVar24);
      auVar14 = vaddss_avx512f(auVar14,auVar24);
      auVar24 = vaddss_avx512f(auVar16,auVar13);
      auVar24 = vsubss_avx512f(auVar24,auVar18);
      auVar18 = vaddss_avx512f(auVar22,auVar18);
      pfVar12[-6] = auVar28._0_4_;
      auVar28 = vaddss_avx512f(auVar21,auVar25);
      auVar32._0_4_ = auVar21._0_4_;
      auVar32._4_4_ = auVar32._0_4_;
      auVar32._8_4_ = auVar32._0_4_;
      auVar32._12_4_ = auVar32._0_4_;
      auVar32._16_4_ = auVar32._0_4_;
      auVar32._20_4_ = auVar32._0_4_;
      auVar32._24_4_ = auVar32._0_4_;
      auVar32._28_4_ = auVar32._0_4_;
      auVar32 = vblendps_avx(ZEXT1632(auVar14),auVar32,0x80);
      auVar16 = vaddss_avx512f(auVar16,auVar18);
      auVar18 = vsubss_avx512f(auVar27,auVar19);
      auVar19 = vaddss_avx512f(auVar19,auVar26);
      auVar30 = SUB6416(ZEXT464(0x40000000),0);
      auVar21 = vfmsub213ss_avx512f(auVar13,auVar30,auVar24);
      auVar14 = vaddss_avx512f(auVar14,auVar28);
      auVar18 = vaddss_avx512f(auVar18,auVar17);
      auVar22 = vfmsub213ss_avx512f(auVar22,auVar30,auVar16);
      auVar17 = vaddss_avx512f(auVar19,auVar17);
      auVar19 = vmovshdup_avx512vl(auVar29);
      auVar13 = vhaddps_avx(auVar29,auVar29);
      pfVar12[-0xf] = auVar14._0_4_;
      auVar14 = vfnmsub231ss_avx512f(auVar19,auVar15,auVar30);
      auVar19 = vfmsub213ss_avx512f(auVar27,auVar30,auVar18);
      auVar26 = vfmsub213ss_avx512f(auVar26,auVar30,auVar17);
      auVar27 = vaddss_avx512f(auVar21,auVar18);
      auVar18 = vsubss_avx512f(auVar18,auVar21);
      auVar21 = vsubss_avx512f(auVar22,auVar17);
      auVar17 = vaddss_avx512f(auVar22,auVar17);
      auVar30 = SUB6416(ZEXT464(0x3f6c835e),0);
      auVar22 = vaddss_avx512f(auVar13,auVar20);
      auVar14 = vaddss_avx512f(auVar20,auVar14);
      auVar20 = vfmadd213ss_avx512f(auVar30,auVar17,auVar27);
      auVar31 = SUB6416(ZEXT464(0x3ec3ef15),0);
      auVar17 = vfmsub213ss_avx512f(auVar17,auVar31,auVar21);
      auVar21 = vaddss_avx512f(auVar21,auVar21);
      auVar29 = vaddss_avx512f(auVar19,auVar24);
      auVar19 = vsubss_avx512f(auVar24,auVar19);
      auVar24 = vsubss_avx512f(auVar26,auVar16);
      auVar16 = vaddss_avx512f(auVar26,auVar16);
      auVar13 = vfmsub213ss_fma(auVar23,SUB6416(ZEXT464(0x40800000),0),auVar22);
      auVar23 = vaddss_avx512f(auVar27,auVar27);
      auVar15 = vfmadd213ss_avx512f(auVar15,SUB6416(ZEXT464(0x40800000),0),auVar14);
      auVar26 = vfmadd213ss_avx512f(auVar30,auVar19,auVar29);
      auVar27 = vfmsub213ss_avx512f(auVar30,auVar16,auVar24);
      auVar29 = vaddss_avx512f(auVar29,auVar29);
      auVar24 = vaddss_avx512f(auVar24,auVar24);
      auVar20 = vfmadd231ss_avx512f(auVar20,auVar18,auVar31);
      auVar17 = vfmsub231ss_avx512f(auVar17,auVar30,auVar18);
      auVar16 = vfmadd231ss_avx512f(auVar26,auVar31,auVar16);
      auVar18 = vfmsub231ss_avx512f(auVar27,auVar31,auVar19);
      pfVar12[-3] = auVar13._0_4_ * 0.5;
      pfVar12[-2] = auVar15._0_4_ * 0.5;
      auVar13 = vshufps_avx512vl(auVar20,auVar17,0);
      auVar13 = vinsertps_avx(auVar13,auVar22,0x30);
      auVar14 = vinsertps_avx512f(auVar14,auVar16,0x10);
      auVar14 = vinsertps_avx512f(auVar14,auVar18,0x20);
      auVar15 = vunpcklps_avx512vl(auVar28,auVar25);
      auVar33._0_8_ = auVar15._0_8_;
      auVar33._8_8_ = auVar33._0_8_;
      auVar33._16_8_ = auVar33._0_8_;
      auVar33._24_8_ = auVar33._0_8_;
      auVar9._4_4_ = auVar13._4_4_ * 0.5;
      auVar9._0_4_ = auVar13._0_4_ * 0.5;
      auVar9._8_4_ = auVar13._8_4_ * 0.5;
      auVar9._12_4_ = auVar13._12_4_ * 0.5;
      auVar9._16_4_ = auVar14._0_4_ * 0.5;
      auVar9._20_4_ = auVar14._4_4_ * 0.5;
      auVar9._24_4_ = auVar14._8_4_ * 0.5;
      auVar9._28_4_ = auVar14._12_4_;
      auVar32 = vsubps_avx(auVar33,auVar32);
      auVar32 = vblendps_avx(auVar9,auVar32,0x81);
      auVar13 = vinsertps_avx512f(auVar16,auVar24,0x10);
      *(undefined1 (*) [32])(pfVar12 + -0xe) = auVar32;
      auVar14 = vinsertps_avx512f(auVar29,auVar18,0x10);
      auVar13 = vsubps_avx(auVar14,auVar13);
      auVar14 = vinsertps_avx512f(auVar20,auVar21,0x10);
      auVar15._0_4_ = auVar13._0_4_ * 0.5;
      auVar15._4_4_ = auVar13._4_4_ * 0.5;
      auVar15._8_4_ = auVar13._8_4_ * 0.5;
      auVar15._12_4_ = auVar13._12_4_ * 0.5;
      uVar2 = vmovlps_avx(auVar15);
      *(undefined8 *)(pfVar12 + -5) = uVar2;
      auVar13 = vinsertps_avx512f(auVar23,auVar17,0x10);
      auVar13 = vsubps_avx(auVar13,auVar14);
      auVar14._0_4_ = auVar13._0_4_ * 0.5;
      auVar14._4_4_ = auVar13._4_4_ * 0.5;
      auVar14._8_4_ = auVar13._8_4_ * 0.5;
      auVar14._12_4_ = auVar13._12_4_ * 0.5;
      uVar2 = vmovlps_avx(auVar14);
      *(undefined8 *)(pfVar12 + -1) = uVar2;
      pfVar12 = pfVar12 + (1L << (M & 0x3fU));
    }
    break;
  default:
    uVar1 = M - 1;
    lVar11 = (M + -2) / 3;
    lVar10 = lVar11 * -3 + -2 + M;
    for (; 0 < Rows; Rows = Rows + -1) {
      scbitrevR2(ioptr,uVar1,BRLow,0.5);
      if (lVar10 == 2) {
        bfR4(ioptr,uVar1,2);
        lStack_50 = 8;
      }
      else {
        lStack_50 = 2;
        if (lVar10 == 1) {
          bfR2(ioptr,uVar1,NDiffU);
          lStack_50 = 4;
        }
      }
      if (uVar1 < 0xc) {
        bfstages(ioptr,uVar1,Utbl,2,lStack_50,lVar11);
      }
      else {
        fftrecurs(ioptr,uVar1,Utbl,2,lStack_50,lVar11);
      }
      frstage(ioptr,M,Utbl);
      ioptr = ioptr + (2L << (uVar1 & 0x3f));
    }
  }
  return;
}

Assistant:

void rffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place real fft on the rows of the input array	*/
/* The result is the complex spectra of the positive frequencies */
/* except the location for the first complex number contains the real */
/* values for DC and Nyquest */
/* INPUTS */
/* *ioptr = real input data array	*/
/* M = log2 of fft size	*/
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = output data array	in the following order */
/* Re(x[0]), Re(x[N/2]), Re(x[1]), Im(x[1]), Re(x[2]), Im(x[2]), ... Re(x[N/2-1]), Im(x[N/2-1]). */

float	scale;
long 	StageCnt;
long 	NDiffU;

M=M-1;
switch (M){
case -1:
	break;
case 0:
	for (;Rows>0;Rows--){
		rfft1pt(ioptr);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
case 1:
	for (;Rows>0;Rows--){
		rfft2pt(ioptr);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		rfft4pt(ioptr);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		rfft8pt(ioptr);				/* a 16 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	scale = 0.5;
	for (;Rows>0;Rows--){

		scbitrevR2(ioptr, M, BRLow, scale);						/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			bfR2(ioptr, M, NDiffU);			/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			bfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE){
			bfstages(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
			frstage(ioptr, M+1, Utbl);
		}

		else{
			fftrecurs(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
			frstage(ioptr, M+1, Utbl);
		}

		ioptr += 2*POW2(M);
	}
}
}